

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_sample_locations_info
          (Impl *this,Value *state,VkSampleLocationsInfoEXT **out_info)

{
  double dVar1;
  VkSampleLocationsInfoEXT *pVVar2;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar3;
  Type pGVar4;
  Number NVar5;
  VkSampleLocationEXT *pVVar6;
  Type pGVar7;
  ulong uVar8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *elem;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  undefined8 local_38;
  
  pVVar2 = (VkSampleLocationsInfoEXT *)ScratchAllocator::allocate_raw(&this->allocator,0x28,0x10);
  if (pVVar2 != (VkSampleLocationsInfoEXT *)0x0) {
    pVVar2->sampleLocationsPerPixel = 0;
    (pVVar2->sampleLocationGridSize).width = 0;
    *(undefined8 *)&(pVVar2->sampleLocationGridSize).height = 0;
    *(undefined8 *)pVVar2 = 0;
    pVVar2->pNext = (void *)0x0;
    pVVar2->pSampleLocations = (VkSampleLocationEXT *)0x0;
  }
  pGVar3 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)state,"sampleLocationGridSize");
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(pGVar3,"width");
  if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    (pVVar2->sampleLocationGridSize).width = (pGVar4->data_).s.length;
    pGVar3 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)state,"sampleLocationGridSize");
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(pGVar3,"height");
    if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      (pVVar2->sampleLocationGridSize).height = (pGVar4->data_).s.length;
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)state,"sampleLocationsPerPixel");
      if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000)
          != (undefined1  [16])0x0) {
        pVVar2->sampleLocationsPerPixel = (pGVar4->data_).s.length;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&stack0xffffffffffffffc8,(Ch *)state);
        NVar5.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(state);
        if (local_38 != NVar5.i64) {
          pGVar4 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)state,"sampleLocations");
          if ((pGVar4->data_).f.flags != 4) {
LAB_00132c38:
            __assert_fail("IsArray()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                          ,0x66a,
                          "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          uVar8 = (ulong)(pGVar4->data_).s.length;
          if (uVar8 == 0) {
            pVVar6 = (VkSampleLocationEXT *)0x0;
          }
          else {
            pVVar6 = (VkSampleLocationEXT *)
                     ScratchAllocator::allocate_raw(&this->allocator,uVar8 << 3,0x10);
            if ((pGVar4->data_).f.flags != 4) goto LAB_00132c38;
          }
          pVVar2->sampleLocationsCount = (pGVar4->data_).s.length;
          pVVar2->pSampleLocations = pVVar6;
          if ((pGVar4->data_).f.flags != 4) {
            __assert_fail("IsArray()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                          ,0x68c,
                          "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     *)((ulong)(pGVar4->data_).s.str & 0xffffffffffff);
          pGVar3 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    *)rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::End(pGVar4);
          if (pGVar3 != this_00) {
            do {
              pGVar7 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       ::operator[]<char_const>(this_00,"x");
              dVar1 = rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::GetDouble(pGVar7);
              pVVar6->x = (float)dVar1;
              pGVar7 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       ::operator[]<char_const>(this_00,"y");
              dVar1 = rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::GetDouble(pGVar7);
              pVVar6->y = (float)dVar1;
              pVVar6 = pVVar6 + 1;
              this_00 = this_00 + 0x10;
              pGVar3 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)rapidjson::
                          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ::End(pGVar4);
            } while (this_00 != pGVar3);
          }
        }
        *out_info = pVVar2;
        return true;
      }
    }
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_sample_locations_info(const Value &state, VkSampleLocationsInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkSampleLocationsInfoEXT>();
	info->sampleLocationGridSize.width = state["sampleLocationGridSize"]["width"].GetUint();
	info->sampleLocationGridSize.height = state["sampleLocationGridSize"]["height"].GetUint();
	info->sampleLocationsPerPixel = static_cast<VkSampleCountFlagBits>(state["sampleLocationsPerPixel"].GetUint());

	if (state.HasMember("sampleLocations"))
	{
		auto &locs = state["sampleLocations"];
		auto *locations = allocator.allocate_n<VkSampleLocationEXT>(locs.Size());
		info->sampleLocationsCount = uint32_t(locs.Size());
		info->pSampleLocations = locations;

		for (auto itr = locs.Begin(); itr != locs.End(); ++itr)
		{
			auto &elem = *itr;
			locations->x = elem["x"].GetFloat();
			locations->y = elem["y"].GetFloat();
			locations++;
		}
	}

	*out_info = info;
	return true;
}